

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::SetMemProtectMode(Recycler *this)

{
  ConfigFlagsTable *pCVar1;
  Boolean BVar2;
  Boolean BVar3;
  Boolean BVar4;
  
  this->enableScanInteriorPointers = true;
  this->enableScanImplicitRoots = true;
  this->disableCollectOnAllocationHeuristics = true;
  pCVar1 = this->recyclerFlagsTable;
  BVar2 = pCVar1->MemProtectHeapBackgroundStress;
  BVar3 = pCVar1->MemProtectHeapConcurrentStress;
  BVar4 = pCVar1->MemProtectHeapConcurrentRepeatStress;
  this->recyclerStress = pCVar1->MemProtectHeapStress;
  this->recyclerBackgroundStress = BVar2;
  this->recyclerConcurrentStress = BVar3;
  this->recyclerConcurrentRepeatStress = BVar4;
  this->recyclerPartialStress = pCVar1->MemProtectHeapPartialStress;
  return;
}

Assistant:

void
Recycler::SetMemProtectMode()
{
    this->enableScanInteriorPointers = true;
    this->enableScanImplicitRoots = true;
    this->disableCollectOnAllocationHeuristics = true;
#ifdef RECYCLER_STRESS
    this->recyclerStress = GetRecyclerFlagsTable().MemProtectHeapStress;
#if ENABLE_CONCURRENT_GC
    this->recyclerBackgroundStress = GetRecyclerFlagsTable().MemProtectHeapBackgroundStress;
    this->recyclerConcurrentStress = GetRecyclerFlagsTable().MemProtectHeapConcurrentStress;
    this->recyclerConcurrentRepeatStress = GetRecyclerFlagsTable().MemProtectHeapConcurrentRepeatStress;
#endif
#if ENABLE_PARTIAL_GC
    this->recyclerPartialStress = GetRecyclerFlagsTable().MemProtectHeapPartialStress;
#endif
#endif
}